

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O2

view_type * __thiscall
memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>::
allocate(view_type *__return_storage_ptr__,
        HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_> *this,
        size_type n)

{
  pointer pvVar1;
  
  if (n == 0) {
    pvVar1 = (pointer)0x0;
  }
  else {
    pvVar1 = (pointer)impl::aligned_malloc<char,16ul>(n * 4);
  }
  __return_storage_ptr__->pointer_ = pvVar1;
  __return_storage_ptr__->size_ = n;
  return __return_storage_ptr__;
}

Assistant:

view_type allocate(size_type n) {
        typename Allocator::template rebind<value_type> allocator;

        pointer ptr = n>0 ? allocator.allocate(n) : nullptr;

        #ifdef VERBOSE
        std::cerr << util::type_printer<HostCoordinator>::print()
                  << "::" + util::blue("alocate") << "(" << n
                  << " [" << n*sizeof(value_type) << " bytes]) @ " << ptr
                  << std::endl;
        #endif

        return view_type(ptr, n);
    }